

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O1

Literal * __thiscall
wasm::ExpressionRunner<wasm::ModuleRunner>::makeExnData
          (Literal *__return_storage_ptr__,ExpressionRunner<wasm::ModuleRunner> *this,Name tag,
          Literals *payload)

{
  char **ppcVar1;
  element_type *this_00;
  undefined1 local_50 [8];
  Name tag_local;
  shared_ptr<wasm::ExnData> allocation;
  undefined1 local_19;
  
  tag_local.super_IString.str._M_len = tag.super_IString.str._M_str;
  local_50 = tag.super_IString.str._M_len;
  tag_local.super_IString.str._M_str = (char *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<wasm::ExnData,std::allocator<wasm::ExnData>,wasm::Name&,wasm::Literals_const&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&allocation,
             (ExnData **)&tag_local.super_IString.str._M_str,(allocator<wasm::ExnData> *)&local_19,
             (Name *)local_50,payload);
  this_00 = allocation.super___shared_ptr<wasm::ExnData,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  allocation.super___shared_ptr<wasm::ExnData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)tag_local.super_IString.str._M_str;
  if (allocation.super___shared_ptr<wasm::ExnData,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      ppcVar1 = &((allocation.super___shared_ptr<wasm::ExnData,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                 ->tag).super_IString.str._M_str;
      *(int *)ppcVar1 = *(int *)ppcVar1 + 1;
      UNLOCK();
    }
    else {
      ppcVar1 = &((allocation.super___shared_ptr<wasm::ExnData,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                 ->tag).super_IString.str._M_str;
      *(int *)ppcVar1 = *(int *)ppcVar1 + 1;
    }
  }
  wasm::Literal::Literal
            (__return_storage_ptr__,
             &allocation.super___shared_ptr<wasm::ExnData,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  if (this_00 != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00);
  }
  if (allocation.super___shared_ptr<wasm::ExnData,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               allocation.super___shared_ptr<wasm::ExnData,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  return __return_storage_ptr__;
}

Assistant:

Literal makeExnData(Name tag, const Literals& payload) {
    auto allocation = std::make_shared<ExnData>(tag, payload);
#if __has_feature(leak_sanitizer) || __has_feature(address_sanitizer)
    __lsan_ignore_object(allocation.get());
#endif
    return Literal(allocation);
  }